

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int owner_parse(char *spec,cpio_owner *owner,char **errmsg)

{
  char *pcVar1;
  int *piVar2;
  ulong uVar3;
  bool bVar4;
  char *local_68;
  char *end_1;
  group *grp;
  char *end;
  passwd *pwent;
  char *user;
  char *g;
  char *ue;
  char *u;
  char **errmsg_local;
  cpio_owner *owner_local;
  char *spec_local;
  
  owner->uid = -1;
  owner->gid = -1;
  owner->uname = (char *)0x0;
  owner->gname = (char *)0x0;
  if (*spec == '\0') {
    *errmsg = "Invalid empty user/group spec";
    return -1;
  }
  if ((*spec == ':') || (g = spec, *spec == '.')) {
    ue = (char *)0x0;
    g = (char *)0x0;
    user = spec + 1;
  }
  else {
    while( true ) {
      bVar4 = false;
      if ((*g != ':') && (bVar4 = false, *g != '.')) {
        bVar4 = *g != '\0';
      }
      if (!bVar4) break;
      g = g + 1;
    }
    user = g;
    ue = spec;
    if (*g != '\0') {
      user = g + 1;
    }
  }
  u = (char *)errmsg;
  errmsg_local = (char **)owner;
  owner_local = (cpio_owner *)spec;
  if (ue == (char *)0x0) {
LAB_001098cb:
    if (*user != '\0') {
      end_1 = (char *)getgrnam(user);
      if ((group *)end_1 == (group *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0;
        uVar3 = strtoul(user,&local_68,10);
        *(int *)((long)errmsg_local + 4) = (int)uVar3;
        piVar2 = __errno_location();
        if ((*piVar2 != 0) || (*local_68 != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",user);
          owner_parse::errbuff[0x7f] = '\0';
          *(char **)u = owner_parse::errbuff;
          return -1;
        }
      }
      else {
        *(__gid_t *)((long)errmsg_local + 4) = ((group *)end_1)->gr_gid;
        pcVar1 = strdup(((group *)end_1)->gr_name);
        errmsg_local[2] = pcVar1;
        if (errmsg_local[2] == (char *)0x0) {
          free(errmsg_local[1]);
          errmsg_local[1] = (char *)0x0;
          goto LAB_001099c3;
        }
      }
    }
    spec_local._4_4_ = 0;
  }
  else {
    pwent = (passwd *)malloc((size_t)(g + (1 - (long)ue)));
    if (pwent != (passwd *)0x0) {
      memcpy(pwent,ue,(long)g - (long)ue);
      *(undefined1 *)((long)pwent + ((long)g - (long)ue)) = 0;
      end = (char *)getpwnam((char *)pwent);
      if ((passwd *)end == (passwd *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0;
        uVar3 = strtoul((char *)pwent,(char **)&grp,10);
        *(int *)errmsg_local = (int)uVar3;
        piVar2 = __errno_location();
        if ((*piVar2 != 0) || (*(char *)&grp->gr_name != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'",pwent);
          owner_parse::errbuff[0x7f] = '\0';
          free(pwent);
          *(char **)u = owner_parse::errbuff;
          return -1;
        }
      }
      else {
        *(__uid_t *)errmsg_local = ((passwd *)end)->pw_uid;
        pcVar1 = strdup(((passwd *)end)->pw_name);
        errmsg_local[1] = pcVar1;
        if (errmsg_local[1] == (char *)0x0) {
          free(pwent);
          goto LAB_001099c3;
        }
        if (*g != '\0') {
          *(undefined4 *)((long)errmsg_local + 4) = *(undefined4 *)(end + 0x14);
        }
      }
      free(pwent);
      goto LAB_001098cb;
    }
LAB_001099c3:
    *(char **)u = "Couldn\'t allocate memory";
    spec_local._4_4_ = -1;
  }
  return spec_local._4_4_;
}

Assistant:

int
owner_parse(const char *spec, struct cpio_owner *owner, const char **errmsg)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	owner->uid = -1;
	owner->gid = -1;

	owner->uname = NULL;
	owner->gname = NULL;

	if (spec[0] == '\0') {
		*errmsg = "Invalid empty user/group spec";
		return (-1);
	}

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = malloc(ue - u + 1);
		if (user == NULL)
			goto alloc_error;
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			owner->uid = pwent->pw_uid;
			owner->uname = strdup(pwent->pw_name);
			if (owner->uname == NULL) {
				free(user);
				goto alloc_error;
			}
			if (*ue != '\0')
				owner->gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			owner->uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				*errmsg = errbuff;
				return (-1);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			owner->gid = grp->gr_gid;
			owner->gname = strdup(grp->gr_name);
			if (owner->gname == NULL) {
				free(owner->uname);
				owner->uname = NULL;
				goto alloc_error;
			}
		} else {
			char *end;
			errno = 0;
			owner->gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				*errmsg = errbuff;
				return (-1);
			}
		}
	}
	return (0);
alloc_error:
	*errmsg = "Couldn't allocate memory";
	return (-1);
}